

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::NullReader::EndStep(NullReader *this)

{
  pointer pNVar1;
  undefined8 in_RDI;
  int commRank;
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  commRank = (int)((ulong)in_RDI >> 0x20);
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac9968);
  if ((pNVar1->IsOpen & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"NullReader",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"EndStep",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"NullReader::EndStep: Engine already closed",&local_b1);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,commRank);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac9bb0);
  if ((pNVar1->IsInStep & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Engine",&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"NullReader",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"EndStep",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffeb0,"NullReader::EndStep: No active step",
               (allocator *)&stack0xfffffffffffffeaf);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,commRank);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
                         *)0xac9dd4);
  pNVar1->IsInStep = false;
  return;
}

Assistant:

void NullReader::EndStep()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: Engine already closed");
    }

    if (!Impl->IsInStep)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: No active step");
    }

    Impl->IsInStep = false;
}